

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcModule.c
# Opt level: O2

cs_err Sparc_global_init(cs_struct *ud)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  Sparc_init(MRI);
  ud->printer = Sparc_printInst;
  ud->printer_info = MRI;
  ud->getinsn_info = MRI;
  ud->disasm = Sparc_getInstruction;
  ud->post_printer = Sparc_post_printer;
  ud->reg_name = Sparc_reg_name;
  ud->insn_id = Sparc_get_insn_id;
  ud->insn_name = Sparc_insn_name;
  ud->group_name = Sparc_group_name;
  return CS_ERR_OK;
}

Assistant:

cs_err Sparc_global_init(cs_struct *ud)
{
	MCRegisterInfo *mri;
	mri = cs_mem_malloc(sizeof(*mri));

	Sparc_init(mri);
	ud->printer = Sparc_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = Sparc_getInstruction;
	ud->post_printer = Sparc_post_printer;

	ud->reg_name = Sparc_reg_name;
	ud->insn_id = Sparc_get_insn_id;
	ud->insn_name = Sparc_insn_name;
	ud->group_name = Sparc_group_name;

	return CS_ERR_OK;
}